

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O2

int png_check_fp_number(png_const_charp string,size_t size,int *statep,png_size_tp whereami)

{
  char *pcVar1;
  byte *pbVar2;
  char cVar3;
  undefined4 uVar4;
  byte bVar5;
  undefined2 uVar6;
  byte bVar7;
  uint uVar8;
  byte bVar10;
  char *pcVar9;
  byte bVar11;
  byte bVar12;
  undefined **ppuVar13;
  undefined8 *puVar14;
  undefined8 *puVar15;
  undefined8 *puVar16;
  undefined8 *puVar17;
  undefined **ppuVar18;
  uint uVar19;
  undefined1 *puVar21;
  undefined4 *puVar22;
  undefined4 *puVar23;
  png_const_charp pcVar24;
  png_const_charp pcVar25;
  ulong uVar26;
  ulong uVar27;
  size_t sVar28;
  undefined8 uVar29;
  uint uVar30;
  long in_FS_OFFSET;
  long in_GS_OFFSET;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  undefined *puStack_38;
  ulong uVar20;
  
  bVar12 = (byte)((ulong)statep >> 8);
  bVar11 = (byte)((ulong)whereami >> 8);
  ppuVar13 = (undefined **)&stack0xffffffffffffffd0;
  ppuVar18 = (undefined **)&stack0xffffffffffffffd0;
  uVar26 = *whereami;
  sVar28 = size;
  if (size < uVar26) {
    sVar28 = uVar26;
  }
  uVar8 = *statep;
  while( true ) {
    pcVar9 = (char *)(ulong)uVar8;
    uVar27 = sVar28;
    if (size <= uVar26) break;
    uVar29 = 4;
    uVar27 = uVar26;
    switch(string[uVar26]) {
    case '+':
      break;
    case ',':
    case '/':
    case ':':
    case ';':
    case '<':
    case '=':
    case '>':
    case '?':
    case '@':
    case 'A':
    case 'B':
    case 'C':
    case 'D':
      goto switchD_0011823e_caseD_2c;
    case '-':
      uVar29 = 0x84;
      break;
    case '.':
      uVar29 = 0x10;
      break;
    case '0':
      uVar29 = 8;
      break;
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
    case '8':
    case '9':
      uVar29 = 0x108;
      break;
    case 'E':
      goto switchD_0011823e_caseD_45;
    default:
      if (string[uVar26] != 'e') goto switchD_0011823e_caseD_2c;
switchD_0011823e_caseD_45:
      uVar29 = 0x20;
    }
    uVar19 = uVar8 & 3;
    uVar20 = (ulong)uVar19;
    uVar30 = (uint)uVar29 & 0x3c;
    bVar7 = (byte)uVar8;
    switch((uVar30 - 4) + uVar19) {
    case 0:
      png_convert_to_rfc1123_buffer::short_months[3][3] = '\0';
      png_convert_to_rfc1123_buffer::short_months[5][0] = 'J';
      png_convert_to_rfc1123_buffer::short_months[0xb][1] = 'e';
      UNK_0013a2e1 = 0xa1;
      UNK_0013a2e4 = 0x10;
      UNK_0013a2eb = 0;
      halt_baddata();
    case 1:
      png_convert_to_rfc1123_buffer::short_months[3][3] = '\0';
      png_convert_to_rfc1123_buffer::short_months[5][0] = 'J';
      png_convert_to_rfc1123_buffer::short_months[0xb][1] = 'e';
      UNK_0013a2e1 = 0xa1;
      UNK_0013a2e4 = 0x10;
      UNK_0013a2eb = 0;
      halt_baddata();
    case 2:
      pbVar2 = (byte *)((long)whereami + in_GS_OFFSET + 0x73);
      *pbVar2 = *pbVar2 & bVar11;
      pbVar2 = (byte *)(string + 0x75);
      *pbVar2 = *pbVar2 & bVar11;
      bVar10 = (byte)(uVar8 >> 8);
      uVar6 = SUB82(statep,0);
      if (*pbVar2 == 0) {
code_r0x0013d135:
        pcVar1 = (char *)((long)statep * 3 + 0x4e);
        *pcVar1 = *pcVar1 + bVar12;
        ppuVar18 = &puStack_38;
        puStack_38 = &DAT_0013a27c;
        UNK_0013a2e4 = bVar10 & 0x10;
        puVar23 = (undefined4 *)(size + 4);
        out(*(undefined4 *)size,uVar6);
code_r0x0013d1b0:
        pbVar2 = (byte *)(uVar20 + 0x61);
        *pbVar2 = *pbVar2 & bVar11;
        bVar35 = (char)*pbVar2 < '\0';
        bVar34 = *pbVar2 == 0;
        bVar31 = (POPCOUNT(*pbVar2) & 1U) == 0;
        puVar22 = (undefined4 *)((long)puVar23 + 1);
        out(*(undefined1 *)puVar23,uVar6);
        if (!bVar35) {
          if (!bVar34) {
            out(*puVar22,uVar6);
            *(byte *)(uVar20 + 0x65) = *(byte *)(uVar20 + 0x65) & bVar11;
            uVar4 = in(uVar6);
            *(undefined4 *)string = uVar4;
            puVar22 = (undefined4 *)((long)puVar23 + 9);
            out(*(undefined4 *)((long)puVar23 + 5),uVar6);
            pbVar2 = (byte *)((long)whereami + 0x6e);
            bVar5 = *pbVar2;
            *pbVar2 = *pbVar2 + bVar11;
            bVar35 = (char)*pbVar2 < '\0';
            bVar34 = *pbVar2 == 0;
            bVar31 = (POPCOUNT(*pbVar2) & 1U) == 0;
            if (!CARRY1(bVar5,bVar11) && !bVar34) {
              pcVar24 = string + 5;
              cVar3 = in(uVar6);
              string[4] = cVar3;
              uVar26 = (long)*(int *)(pcVar9 + 0x75) * 0x6f6e6b6e;
              puVar14 = (undefined8 *)(uVar26 & 0xffffffff);
              bVar32 = (long)(int)uVar26 != uVar26;
              if (bVar32 || bVar34) {
                UNK_0013a2e4 = bVar10 & 0x10;
                bVar35 = false;
                bVar34 = false;
                bVar31 = false;
                puVar23 = (undefined4 *)((long)puVar23 + 10);
                out(*(undefined1 *)puVar22,uVar6);
code_r0x0013d265:
                puVar21 = (undefined1 *)((long)puVar23 + 1);
                out(*(undefined1 *)puVar23,uVar6);
                puVar15 = puVar14;
                goto code_r0x0013d26a;
              }
              if (bVar32) {
                halt_baddata();
              }
              puVar23 = puVar22;
              if (bVar34) goto code_r0x0013d265;
              pbVar2 = (byte *)((long)whereami + in_GS_OFFSET + 0x74);
              *pbVar2 = *pbVar2 & bVar11;
              *(byte *)((long)whereami + 0x73) = *(byte *)((long)whereami + 0x73) & bVar11;
              *(byte *)((long)whereami + 0x6e) = *(byte *)((long)whereami + 0x6e) & bVar11;
              *(byte *)(uVar20 + 0x73) = *(byte *)(uVar20 + 0x73) & bVar12;
              pbVar2 = &UNK_0013a2eb + in_GS_OFFSET;
              bVar33 = CARRY1(*pbVar2,bVar7);
              bVar32 = SCARRY1(*pbVar2,bVar7);
              *pbVar2 = *pbVar2 + bVar7;
              bVar35 = (char)*pbVar2 < '\0';
              bVar34 = *pbVar2 == 0;
              bVar31 = (POPCOUNT(*pbVar2) & 1U) == 0;
              goto code_r0x0013d2e4;
            }
            *(byte *)(puVar23 + 0x1e) = *(byte *)(puVar23 + 0x1e) & bVar11;
            pcVar24 = string + 4;
            goto code_r0x0013d24a;
          }
          cVar3 = in(uVar6);
          *string = cVar3;
          puVar21 = (undefined1 *)((long)puVar23 + 5);
          out(*puVar22,uVar6);
          puVar15 = (undefined8 *)(ulong)*(uint *)((long)whereami + 0x74);
          uVar26 = (long)*(int *)(string + 0x6f) * 0x676e7000;
          uVar20 = uVar26 & 0xffffffff;
          bVar32 = (long)(int)uVar26 != uVar26;
          pcVar24 = (png_const_charp)*puVar15;
          puVar14 = puVar15 + 1;
          if (bVar32) {
            if (!bVar34) {
              puVar16 = (undefined8 *)(ulong)(uint)(*(int *)(uVar20 + 0x65) * 0x70);
              pcVar25 = (png_const_charp)*puVar16;
              if (bVar34) {
                out(*puVar21,uVar6);
                puVar17 = puVar16 + 2;
                out(*(undefined1 *)((long)puVar23 + 6),uVar6);
                uVar20 = (ulong)(uint)(iRam0000000029a00cb6 * 0x64696c61);
                bVar31 = false;
                UNK_0013a2e1 = bVar11 & 0xa1;
                bVar34 = false;
                bVar5 = 3;
                puVar23 = (undefined4 *)0x29a00c40;
                goto code_r0x0013d22d;
              }
              if (!bVar34) {
                halt_baddata();
              }
              goto code_r0x0013d280;
            }
            puVar15 = puVar15 + 1;
            if (bVar32 || bVar34) goto code_r0x0013d26a;
code_r0x0013d2d8:
            puVar22 = (undefined4 *)0x752427fc;
            bVar33 = false;
            bVar32 = SCARRY1(bVar7,'\0');
            bVar35 = false;
            bVar34 = true;
            bVar31 = true;
            UNK_0013a2eb = bVar7;
            goto code_r0x0013d2e4;
          }
          *puVar15 = 0x736b6e75;
          cVar3 = bVar10 - *pcVar9;
          bVar35 = cVar3 < '\0';
          bVar34 = cVar3 == '\0';
          bVar31 = (POPCOUNT(cVar3) & 1U) == 0;
code_r0x0013d26a:
          pcVar25 = (png_const_charp)*puVar15;
          ppuVar18 = (undefined **)(puVar15 + 1);
          uVar20 = (ulong)*(uint *)(pcVar9 + 0x75);
          out(*puVar21,uVar6);
          puVar22 = (undefined4 *)0x29a00c40;
          bVar33 = true;
          puVar14 = puVar15 + 1;
          pcVar24 = pcVar25;
          bVar32 = bVar33;
          if (bVar34) goto code_r0x0013d2e4;
          out(uRam0000000029a00c40,uVar6);
          pbVar2 = (byte *)(uVar20 + 0x61);
          bVar33 = false;
          *pbVar2 = *pbVar2 & bVar11;
          bVar35 = (char)*pbVar2 < '\0';
          bVar34 = *pbVar2 == 0;
          bVar31 = (POPCOUNT(*pbVar2) & 1U) == 0;
          puVar23 = (undefined4 *)0x29a00c45;
          out(uRam0000000029a00c44,uVar6);
          if (!bVar35) goto code_r0x0013d29e;
          uVar20 = (ulong)*(uint *)(pcVar9 + 0x75);
          out(uRam0000000029a00c45,uVar6);
code_r0x0013d280:
          puVar23 = (undefined4 *)0xff20d7cd;
          out(uRam00000000ff20d7cc,uVar6);
          if (!bVar34) {
            pcVar24 = pcVar25 + 1;
            cVar3 = in(uVar6);
            *pcVar25 = cVar3;
            uVar26 = (long)*(int *)(pcVar9 + 99) * 0x72706d6f;
            ppuVar18 = (undefined **)(uVar26 & 0xffffffff);
            if ((long)(int)uVar26 == uVar26) goto joined_r0x0013d306;
            uVar26 = (long)*(int *)(pcVar25 + 0x6f) * 0x66756220;
            uVar20 = uVar26 & 0xffffffff;
            bVar33 = (long)(int)uVar26 != uVar26;
            pcVar25 = pcVar24;
            if (!bVar33) goto code_r0x0013d29e;
            goto code_r0x0013d2be;
          }
          goto code_r0x0013d35d;
        }
        if (bVar34) {
          uVar20 = (ulong)(uint)(puVar23[0x1c] * 0x77);
          puVar23 = (undefined4 *)((long)puVar23 + 2);
          out(*(undefined1 *)puVar22,uVar6);
          UNK_0013a2e4 = bVar10 & 0x10;
          bVar34 = false;
          bVar5 = 1;
code_r0x0013d233:
          uVar26 = (long)*(int *)(uVar20 + 0x65) * 0x70;
          bVar31 = (long)(int)uVar26 != uVar26;
          pcVar24 = *(png_const_charp *)(uVar26 & 0xffffffff);
          ppuVar18 = (undefined **)((undefined8 *)(uVar26 & 0xffffffff) + 1);
          goto code_r0x0013d238;
        }
        puVar17 = (undefined8 *)(ulong)(uint)(*(int *)(uVar20 + 0x65) * 0x70);
        pbVar2 = (byte *)(pcVar9 + 0x6e);
        bVar31 = CARRY1(*pbVar2,bVar12);
        *pbVar2 = *pbVar2 + bVar12;
        bVar34 = *pbVar2 == 0;
        bVar5 = POPCOUNT(*pbVar2);
        puVar23 = puVar22;
code_r0x0013d22d:
        bVar5 = bVar5 & 1;
        pcVar25 = (png_const_charp)*puVar17;
        if (bVar31) {
          if (!bVar34) goto code_r0x0013d233;
          if (!bVar31) goto code_r0x0013d2fd;
          puVar22 = puVar23 + 1;
          out(*puVar23,uVar6);
          puVar23 = (undefined4 *)((long)puVar23 + 5);
          out(*(undefined1 *)puVar22,uVar6);
        }
        ppuVar18 = (undefined **)(puVar17 + 1);
        pbVar2 = (byte *)((long)statep + 0x75);
        bVar33 = false;
        *pbVar2 = *pbVar2 & bVar10;
        bVar34 = *pbVar2 == 0;
        bVar31 = (POPCOUNT(*pbVar2) & 1U) == 0;
code_r0x0013d29e:
        if (bVar33) {
          pcVar24 = pcVar25;
          if (bVar31) {
joined_r0x0013d306:
            pcVar25 = pcVar24;
            if (!bVar34) {
              halt_baddata();
            }
            goto code_r0x0013d309;
          }
          bVar31 = false;
          bVar34 = true;
          bVar35 = true;
          pcVar24 = pcVar25 + 4;
          uVar4 = in(uVar6);
          UNK_0013a2eb = bVar7;
          *(undefined4 *)pcVar25 = uVar4;
          if (!SCARRY1(bVar7,'\0')) goto code_r0x0013d2a8;
          pbVar2 = (byte *)((long)statep + in_FS_OFFSET + (long)puVar23 * 2 + 0x75);
          *pbVar2 = *pbVar2 & bVar12;
code_r0x0013d31f:
          out(*(undefined1 *)puVar23,uVar6);
          puVar22 = (undefined4 *)((long)puVar23 + 1);
          goto code_r0x0013d320;
        }
code_r0x0013d309:
        pbVar2 = (byte *)((long)statep + in_FS_OFFSET + 0x65);
        *pbVar2 = *pbVar2 & bVar10;
        bVar5 = *pbVar2;
        pcVar24 = pcVar25 + 1;
        cVar3 = in(uVar6);
        *pcVar25 = cVar3;
        puVar22 = puVar23 + 1;
        out(*puVar23,uVar6);
        if (bVar5 != 0) {
          halt_baddata();
        }
        bVar32 = 0x5e < bVar11;
        UNK_0013a2e1 = bVar11 + 0xa1;
        bVar34 = false;
code_r0x0013d318:
        puVar23 = puVar22 + 1;
        out(*puVar22,uVar6);
        if (!bVar32) {
          pbVar2 = (byte *)((long)statep + (long)puVar23 * 2 + 0x75);
          *pbVar2 = *pbVar2 & bVar12;
          goto code_r0x0013d31f;
        }
        if (bVar32 || bVar34) {
          if (!bVar32) {
            halt_baddata();
          }
          *(undefined8 *)((long)ppuVar18 + -8) = uVar29;
          png_convert_to_rfc1123_buffer::short_months[3][3] = bVar12;
          halt_baddata();
        }
        cVar3 = in(uVar6);
        *pcVar24 = cVar3;
        bVar31 = (long)(int)((long)*(int *)(pcVar24 + 0x6f) * 0x206e6920) !=
                 (long)*(int *)(pcVar24 + 0x6f) * 0x206e6920;
        bVar35 = bVar31;
code_r0x0013d391:
        if (bVar35) {
          halt_baddata();
        }
      }
      else {
        out(*(undefined4 *)size,uVar6);
        *(byte *)((long)statep + 0x61) = *(byte *)((long)statep + 0x61) & bVar12;
        out(*(undefined1 *)(size + 4),uVar6);
        pcVar1 = (char *)(in_GS_OFFSET + (int)(uVar19 + 0x78));
        *pcVar1 = *pcVar1 + bVar12;
        bVar34 = *pcVar1 == '\0';
        bVar5 = POPCOUNT(*pcVar1) & 1;
        if (!bVar34) {
          uVar20 = (ulong)*(uint *)(pcVar9 + 0x75);
          out(*(undefined1 *)(size + 5),uVar6);
          uVar26 = (long)*statep * 0x20;
          pcVar24 = (png_const_charp)(uVar26 & 0xffffffff);
          bVar31 = (long)(int)uVar26 != uVar26;
          puVar23 = (undefined4 *)(size + 10);
          out(*(undefined4 *)(size + 6),uVar6);
          if (bVar34) {
            pcVar24[0x66] = pcVar24[0x66] & bVar11;
            *(byte *)(uVar20 + 0x65) = *(byte *)(uVar20 + 0x65) & bVar11;
            string = pcVar24 + 4;
            uVar4 = in(uVar6);
            *(undefined4 *)pcVar24 = uVar4;
            size = size + 0xe;
            out(*puVar23,uVar6);
            goto code_r0x0013d135;
          }
          if (!bVar34) {
            out(*puVar23,uVar6);
            *(byte *)(uVar20 + 0x65) = *(byte *)(uVar20 + 0x65) & bVar11;
            string = pcVar24 + 4;
            uVar4 = in(uVar6);
            *(undefined4 *)pcVar24 = uVar4;
            puVar23 = (undefined4 *)(size + 0x12);
            out(*(undefined4 *)(size + 0xe),uVar6);
            pcVar24[uVar20 * 2 + 0x73] = pcVar24[uVar20 * 2 + 0x73] + bVar12;
            goto code_r0x0013d1b0;
          }
          if (bVar34) goto code_r0x0013d1c7;
          ppuVar18 = (undefined **)&stack0xffffffffffffffd0;
          if (bVar31) {
            halt_baddata();
          }
code_r0x0013d238:
          bVar35 = bVar5 == 0;
          if (bVar34) {
            out(*(undefined1 *)puVar23,uVar6);
            goto code_r0x0013d23f;
          }
code_r0x0013d2a8:
          if (bVar31) {
            uVar26 = (long)*(int *)(pcVar24 + 0x6e) * 0x66756220;
            uVar20 = uVar26 & 0xffffffff;
            bVar31 = (long)(int)uVar26 == uVar26;
            if (bVar31) {
              if (bVar31) {
                halt_baddata();
              }
              if (bVar35) goto code_r0x0013d31f;
              png_convert_to_rfc1123_buffer::short_months[0xb][1] = bVar10 & 'e';
              bVar31 = true;
              puVar22 = puVar23;
              goto code_r0x0013d2bd;
            }
            puVar14 = ppuVar18;
            if (!bVar34) goto code_r0x0013d2d8;
            pcVar9 = png_convert_to_rfc1123_buffer::short_months[0xb] + in_GS_OFFSET + 1;
            *pcVar9 = *pcVar9 & bVar10;
            bVar11 = *pcVar9;
code_r0x0013d2fc:
            bVar34 = bVar11 == 0;
            out(*(undefined1 *)puVar23,uVar6);
            puVar23 = (undefined4 *)((long)puVar23 + 1);
code_r0x0013d2fd:
            out(*(undefined1 *)puVar23,uVar6);
            out(*(undefined4 *)((long)puVar23 + 1),uVar6);
            if (bVar34) {
              halt_baddata();
            }
            halt_baddata();
          }
          puVar22 = puVar23;
          if (!bVar34) {
            bVar31 = (long)(int)((long)(int)puVar23[8] * 0x5f676e70) !=
                     (long)(int)puVar23[8] * 0x5f676e70;
            goto code_r0x0013d395;
          }
code_r0x0013d320:
          uVar8 = *(uint *)((long)whereami + 0x74);
          pbVar2 = &UNK_0013a2e1 + in_FS_OFFSET;
          bVar31 = CARRY1(*pbVar2,bVar11);
          bVar5 = *pbVar2;
          *pbVar2 = *pbVar2 + bVar11;
          bVar34 = *pbVar2 == 0;
          if (-1 < (char)*pbVar2) goto code_r0x0013d3a1;
          puVar23 = puVar22 + 1;
          out(*puVar22,uVar6);
          bVar35 = SCARRY1(bVar5,bVar11);
          if (!bVar31) {
            *(byte *)statep = (byte)*statep & bVar10;
            *statep = *statep ^ uVar8;
            halt_baddata();
          }
          goto code_r0x0013d391;
        }
        ppuVar13 = &puStack_38;
        puStack_38 = (undefined *)0x6f207361;
        if (bVar34) {
          halt_baddata();
        }
        out(*(undefined1 *)(size + 5),uVar6);
        puVar23 = (undefined4 *)0xff0756dd;
        out(uRam00000000ff0756dc,uVar6);
code_r0x0013d1c7:
        out(*(undefined1 *)puVar23,uVar6);
        ppuVar18 = ppuVar13;
code_r0x0013d23f:
        pcVar24 = *ppuVar18;
        ppuVar18 = (undefined **)((long *)ppuVar18 + 1);
        uVar20 = (ulong)*(uint *)(pcVar9 + 0x75);
        out(*(undefined1 *)((long)puVar23 + 1),uVar6);
        out((undefined1)uRam0000000029a00c40,uVar6);
        puVar22 = (undefined4 *)0x29a00c45;
        out(CONCAT13(uRam0000000029a00c44,uRam0000000029a00c40._1_3_),uVar6);
code_r0x0013d24a:
        UNK_0013a2e4 = bVar10 & 0x10;
        bVar31 = false;
code_r0x0013d2bd:
        bVar33 = false;
        bVar34 = false;
        bVar35 = false;
        puVar23 = (undefined4 *)((long)puVar22 + 1);
        out(*(undefined1 *)puVar22,uVar6);
code_r0x0013d2be:
        out(*(undefined1 *)puVar23,uVar6);
        out(*(undefined4 *)((long)puVar23 + 1),uVar6);
        if (!bVar34) {
          halt_baddata();
        }
        puVar22 = (undefined4 *)((long)puVar23 + 9);
        out(*(undefined4 *)((long)puVar23 + 5),uVar6);
        puVar14 = ppuVar18;
        bVar32 = bVar33;
code_r0x0013d2e4:
        pcVar25 = pcVar24 + 4;
        uVar4 = in(uVar6);
        *(undefined4 *)pcVar24 = uVar4;
        if (bVar32) {
          uVar20 = (ulong)*(uint *)(pcVar9 + 0x75);
          out(*(undefined1 *)puVar22,uVar6);
code_r0x0013d35d:
          puVar23 = (undefined4 *)0xff168308;
          bVar32 = false;
code_r0x0013d361:
          out(*puVar23,uVar6);
          if (!bVar32 && !bVar34) {
            pcVar25[uVar20 * 2 + 99] = pcVar25[uVar20 * 2 + 99] & bVar11;
            halt_baddata();
          }
          if (!bVar35) {
            halt_baddata();
          }
          pcVar9[0x43] = pcVar9[0x43] + bVar12;
          halt_baddata();
        }
        if (!bVar33) goto code_r0x0013d35d;
        uVar26 = (long)*(int *)(pcVar24 + 0x72) * 0x66756220;
        uVar20 = uVar26 & 0xffffffff;
        bVar32 = (long)(int)uVar26 != uVar26;
        if (!bVar32) {
          if (bVar32) {
            if (!bVar31) {
              png_convert_to_rfc1123_buffer::short_months[0xb][1] = bVar10 & 'e';
              bVar11 = 'e';
              puVar23 = puVar22;
              goto code_r0x0013d2fc;
            }
            if (!bVar32) {
              halt_baddata();
            }
          }
          puVar23 = (undefined4 *)((long)puVar22 + 1);
          out(*(undefined1 *)puVar22,uVar6);
          goto code_r0x0013d361;
        }
        ppuVar18 = (undefined **)puVar14;
        pcVar24 = pcVar25;
        if (bVar35) goto code_r0x0013d318;
        puVar23 = (undefined4 *)((long)puVar22 + 1);
        out(*(undefined1 *)puVar22,uVar6);
        pbVar2 = (byte *)(pcVar9 + 0x6e);
        bVar31 = false;
        *pbVar2 = *pbVar2 & bVar12;
        bVar34 = *pbVar2 == 0;
      }
code_r0x0013d395:
      if (!bVar31) {
        if (bVar34) {
          halt_baddata();
        }
        halt_baddata();
      }
      if (bVar34) {
        halt_baddata();
      }
      if (!bVar34) {
        *pcVar9 = *pcVar9 + bVar7;
        *pcVar9 = *pcVar9 + bVar7;
        *pcVar9 = *pcVar9 + bVar7;
        *(byte *)whereami = (char)*whereami + bVar12;
        halt_baddata();
      }
      puVar22 = (undefined4 *)((long)puVar23 + 1);
      out(*(undefined1 *)puVar23,uVar6);
code_r0x0013d3a1:
      out(*(undefined1 *)puVar22,uVar6);
      *pcVar9 = *pcVar9 + bVar7;
      *pcVar9 = *pcVar9 + bVar7;
      *pcVar9 = *pcVar9 + bVar7;
      *(char *)((long)statep + 0x4b) = *(char *)((long)statep + 0x4b) + bVar10;
      halt_baddata();
    case 3:
      png_convert_to_rfc1123_buffer::short_months[3][3] = '\0';
      png_convert_to_rfc1123_buffer::short_months[5][0] = 'J';
      png_convert_to_rfc1123_buffer::short_months[0xb][1] = 'e';
      UNK_0013a2e1 = 0xa1;
      UNK_0013a2e4 = 0x10;
      UNK_0013a2eb = 0;
      return uVar8;
    }
    uVar30 = uVar30 | uVar19;
    if (((uVar30 != 0x20) && (uVar30 != 0x21)) || ((uVar8 & 8) == 0)) break;
    uVar8 = uVar8 & 0x1c0 | 2;
    uVar26 = uVar26 + 1;
  }
switchD_0011823e_caseD_2c:
  *statep = uVar8;
  *whereami = uVar27;
  return uVar8 >> 3 & 1;
}

Assistant:

int /* PRIVATE */
png_check_fp_number(png_const_charp string, size_t size, int *statep,
    png_size_tp whereami)
{
   int state = *statep;
   size_t i = *whereami;

   while (i < size)
   {
      int type;
      /* First find the type of the next character */
      switch (string[i])
      {
      case 43:  type = PNG_FP_SAW_SIGN;                   break;
      case 45:  type = PNG_FP_SAW_SIGN + PNG_FP_NEGATIVE; break;
      case 46:  type = PNG_FP_SAW_DOT;                    break;
      case 48:  type = PNG_FP_SAW_DIGIT;                  break;
      case 49: case 50: case 51: case 52:
      case 53: case 54: case 55: case 56:
      case 57:  type = PNG_FP_SAW_DIGIT + PNG_FP_NONZERO; break;
      case 69:
      case 101: type = PNG_FP_SAW_E;                      break;
      default:  goto PNG_FP_End;
      }

      /* Now deal with this type according to the current
       * state, the type is arranged to not overlap the
       * bits of the PNG_FP_STATE.
       */
      switch ((state & PNG_FP_STATE) + (type & PNG_FP_SAW_ANY))
      {
      case PNG_FP_INTEGER + PNG_FP_SAW_SIGN:
         if ((state & PNG_FP_SAW_ANY) != 0)
            goto PNG_FP_End; /* not a part of the number */

         png_fp_add(state, type);
         break;

      case PNG_FP_INTEGER + PNG_FP_SAW_DOT:
         /* Ok as trailer, ok as lead of fraction. */
         if ((state & PNG_FP_SAW_DOT) != 0) /* two dots */
            goto PNG_FP_End;

         else if ((state & PNG_FP_SAW_DIGIT) != 0) /* trailing dot? */
            png_fp_add(state, type);

         else
            png_fp_set(state, PNG_FP_FRACTION | type);

         break;

      case PNG_FP_INTEGER + PNG_FP_SAW_DIGIT:
         if ((state & PNG_FP_SAW_DOT) != 0) /* delayed fraction */
            png_fp_set(state, PNG_FP_FRACTION | PNG_FP_SAW_DOT);

         png_fp_add(state, type | PNG_FP_WAS_VALID);

         break;

      case PNG_FP_INTEGER + PNG_FP_SAW_E:
         if ((state & PNG_FP_SAW_DIGIT) == 0)
            goto PNG_FP_End;

         png_fp_set(state, PNG_FP_EXPONENT);

         break;

   /* case PNG_FP_FRACTION + PNG_FP_SAW_SIGN:
         goto PNG_FP_End; ** no sign in fraction */

   /* case PNG_FP_FRACTION + PNG_FP_SAW_DOT:
         goto PNG_FP_End; ** Because SAW_DOT is always set */

      case PNG_FP_FRACTION + PNG_FP_SAW_DIGIT:
         png_fp_add(state, type | PNG_FP_WAS_VALID);
         break;

      case PNG_FP_FRACTION + PNG_FP_SAW_E:
         /* This is correct because the trailing '.' on an
          * integer is handled above - so we can only get here
          * with the sequence ".E" (with no preceding digits).
          */
         if ((state & PNG_FP_SAW_DIGIT) == 0)
            goto PNG_FP_End;

         png_fp_set(state, PNG_FP_EXPONENT);

         break;

      case PNG_FP_EXPONENT + PNG_FP_SAW_SIGN:
         if ((state & PNG_FP_SAW_ANY) != 0)
            goto PNG_FP_End; /* not a part of the number */

         png_fp_add(state, PNG_FP_SAW_SIGN);

         break;

   /* case PNG_FP_EXPONENT + PNG_FP_SAW_DOT:
         goto PNG_FP_End; */

      case PNG_FP_EXPONENT + PNG_FP_SAW_DIGIT:
         png_fp_add(state, PNG_FP_SAW_DIGIT | PNG_FP_WAS_VALID);

         break;

   /* case PNG_FP_EXPONEXT + PNG_FP_SAW_E:
         goto PNG_FP_End; */

      default: goto PNG_FP_End; /* I.e. break 2 */
      }

      /* The character seems ok, continue. */
      ++i;
   }

PNG_FP_End:
   /* Here at the end, update the state and return the correct
    * return code.
    */
   *statep = state;
   *whereami = i;

   return (state & PNG_FP_SAW_DIGIT) != 0;
}